

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O1

void __thiscall QDnsLookupPrivate::nameserverPortChanged(QDnsLookupPrivate *this)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  QPropertyData<unsigned_short> local_2a;
  void *local_28;
  QPropertyData<unsigned_short> *pQStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if ((*(long **)&this->field_0x48 != (long *)0x0) && (**(long **)&this->field_0x48 != 0)) {
    QBindingStorage::registerDependency_helper((QUntypedPropertyData *)&this->field_0x40);
  }
  local_2a.val = (this->port).super_QPropertyData<unsigned_short>.val;
  pQStack_20 = &local_2a;
  local_28 = (void *)0x0;
  QMetaObject::activate(pQVar1,&QDnsLookup::staticMetaObject,4,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void nameserverPortChanged()
    {
        emit q_func()->nameserverPortChanged(port);
    }